

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O1

type cm::operator<(char (*l) [2],String *r)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  
  sVar1 = (r->view_)._M_len;
  if (sVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar2 = memcmp(l,(r->view_)._M_str,(ulong)(sVar1 != 0));
    uVar3 = (ulong)uVar2;
  }
  if ((int)uVar3 == 0) {
    uVar3 = 0xffffffff80000000;
    if (-0x80000000 < (long)(1 - sVar1)) {
      uVar3 = 1 - sVar1;
    }
    if (0x7ffffffe < (long)uVar3) {
      uVar3 = 0;
    }
  }
  return (type)((byte)(uVar3 >> 0x1f) & 1);
}

Assistant:

string_view view() const noexcept { return this->view_; }